

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::(anonymous_namespace)::TwoWayPipeEnd> __thiscall
kj::
heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
          (kj *this,Own<kj::(anonymous_namespace)::AsyncPipe> *params,
          Own<kj::(anonymous_namespace)::AsyncPipe> *params_1)

{
  AsyncPipe *pAVar1;
  undefined8 *puVar2;
  TwoWayPipeEnd *extraout_RDX;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd> OVar3;
  
  puVar2 = (undefined8 *)operator_new(0x38);
  *puVar2 = &PTR_read_0062b590;
  puVar2[1] = &PTR_write_0062b610;
  pAVar1 = params->ptr;
  params->ptr = (AsyncPipe *)0x0;
  puVar2[2] = params->disposer;
  puVar2[3] = pAVar1;
  pAVar1 = params_1->ptr;
  params_1->ptr = (AsyncPipe *)0x0;
  puVar2[4] = params_1->disposer;
  puVar2[5] = pAVar1;
  UnwindDetector::UnwindDetector((UnwindDetector *)(puVar2 + 6));
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::TwoWayPipeEnd>::instance;
  *(undefined8 **)(this + 8) = puVar2;
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::TwoWayPipeEnd>::instance;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}